

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O2

void raw_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  backend_socket_log((Seat *)plug[-6].vt,(LogContext *)plug[-5].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-1].vt,*(_Bool *)((long)&plug[-3].vt + 2));
  if (type == PLUGLOG_CONNECT_SUCCESS) {
    *(undefined1 *)((long)&plug[-3].vt + 2) = 1;
    if ((Ldisc *)plug[-4].vt != (Ldisc *)0x0) {
      ldisc_check_sendok((Ldisc *)plug[-4].vt);
      return;
    }
  }
  return;
}

Assistant:

static void raw_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                    const char *error_msg, int error_code)
{
    Raw *raw = container_of(plug, Raw, plug);
    backend_socket_log(raw->seat, raw->logctx, type, addr, port, error_msg,
                       error_code, raw->conf, raw->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        raw->socket_connected = true;
        if (raw->ldisc)
            ldisc_check_sendok(raw->ldisc);
    }
}